

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

int __thiscall
DLevelScript::DoSpawnSpotFacing(DLevelScript *this,int type,int spot,int tid,bool force)

{
  int iVar1;
  AActor *pAVar2;
  int iVar3;
  TObjPtr<AActor> *obj;
  FActorIterator iterator;
  DAngle local_70;
  DVector3 local_68;
  DAngle local_48;
  FActorIterator local_40;
  
  if (spot == 0) {
    obj = &this->activator;
    pAVar2 = GC::ReadBarrier<AActor>((AActor **)obj);
    if (pAVar2 == (AActor *)0x0) {
      iVar3 = 0;
    }
    else {
      pAVar2 = GC::ReadBarrier<AActor>((AActor **)obj);
      local_68.X = (pAVar2->__Pos).X;
      local_68.Y = (pAVar2->__Pos).Y;
      local_68.Z = (pAVar2->__Pos).Z;
      pAVar2 = GC::ReadBarrier<AActor>((AActor **)obj);
      local_48.Degrees = (pAVar2->Angles).Yaw.Degrees;
      iVar3 = DoSpawn(type,&local_68,tid,&local_48,force);
    }
  }
  else {
    local_40.base = (AActor *)0x0;
    iVar3 = 0;
    local_40.id = spot;
    while( true ) {
      pAVar2 = FActorIterator::Next(&local_40);
      if (pAVar2 == (AActor *)0x0) break;
      local_68.X = (pAVar2->__Pos).X;
      local_68.Y = (pAVar2->__Pos).Y;
      local_68.Z = (pAVar2->__Pos).Z;
      local_70.Degrees = (pAVar2->Angles).Yaw.Degrees;
      iVar1 = DoSpawn(type,&local_68,tid,&local_70,force);
      iVar3 = iVar3 + iVar1;
    }
  }
  return iVar3;
}

Assistant:

int DLevelScript::DoSpawnSpotFacing (int type, int spot, int tid, bool force)
{
	int spawned = 0;

	if (spot != 0)
	{
		FActorIterator iterator (spot);
		AActor *aspot;

		while ( (aspot = iterator.Next ()) )
		{
			spawned += DoSpawn (type, aspot->Pos(), tid, aspot->Angles.Yaw, force);
		}
	}
	else if (activator != NULL)
	{
			spawned += DoSpawn (type, activator->Pos(), tid, activator->Angles.Yaw, force);
	}
	return spawned;
}